

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall
jpge::jpeg_encoder::emit_dht(jpeg_encoder *this,uint8 *bits,uint8 *val,int index,bool ac_flag)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  
  emit_marker(this,0xc4);
  uVar3 = 0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    uVar3 = uVar3 + bits[lVar1 + 1];
  }
  emit_word(this,uVar3 + 0x13);
  emit_byte(this,ac_flag * '\x10' + (char)index);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    emit_byte(this,bits[lVar1 + 1]);
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    emit_byte(this,val[uVar2]);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_dht(uint8* bits, uint8* val, int index, bool ac_flag)
	{
		emit_marker(M_DHT);

		int length = 0;
		for (int i = 1; i <= 16; i++)
			length += bits[i];

		emit_word(length + 2 + 1 + 16);
		emit_byte(static_cast<uint8>(index + (ac_flag << 4)));

		for (int i = 1; i <= 16; i++)
			emit_byte(bits[i]);

		for (int i = 0; i < length; i++)
			emit_byte(val[i]);
	}